

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O3

void __thiscall Assimp::ObjFile::Model::Model(Model *this)

{
  _Rb_tree_header *p_Var1;
  char *__end;
  
  (this->m_ModelName)._M_dataplus._M_p = (pointer)&(this->m_ModelName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"","");
  p_Var1 = &(this->m_Groups)._M_t._M_impl.super__Rb_tree_header;
  (this->m_Groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_Groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->m_Objects,0,0x90);
  (this->m_Groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_Groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_Groups)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_pGroupFaceIDs = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  (this->m_strActiveGroup)._M_dataplus._M_p = (pointer)&(this->m_strActiveGroup).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_strActiveGroup,"","");
  p_Var1 = &(this->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_TextureCoord).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_TextureCoord).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_TextureCoord).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_TextureCoord).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->m_pCurrentMesh = (Mesh *)0x0;
  (this->m_Meshes).
  super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Meshes).
  super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Meshes).
  super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Model() :
        m_ModelName(""),
        m_pCurrent(NULL),
        m_pCurrentMaterial(NULL),
        m_pDefaultMaterial(NULL),
        m_pGroupFaceIDs(NULL),
        m_strActiveGroup(""),
        m_TextureCoordDim(0),
        m_pCurrentMesh(NULL)
    {
        // empty
    }